

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCopyInfo.cpp
# Opt level: O0

void __thiscall Js::StringCopyInfoStack::CreateStack(StringCopyInfoStack *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TempArenaAllocatorObject *pTVar4;
  ArenaAllocator *alloc;
  LargeStack<Js::StringCopyInfo> *pLVar5;
  StringCopyInfoStack *this_local;
  
  if (this->allocator != (TempArenaAllocatorObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7a,"(!allocator)","!allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->stack != (LargeStack<Js::StringCopyInfo> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7b,"(!stack)","!stack");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = ScriptContext::GetTemporaryAllocator(this->scriptContext,L"StringCopyInfoStack");
  this->allocator = pTVar4;
  if (this->allocator == (TempArenaAllocatorObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x7e,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  alloc = TempArenaAllocatorWrapper<false>::GetAllocator(this->allocator);
  pLVar5 = LargeStack<Js::StringCopyInfo>::New(alloc);
  this->stack = pLVar5;
  if (this->stack == (LargeStack<Js::StringCopyInfo> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StringCopyInfo.cpp"
                                ,0x80,"(stack)","stack");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void StringCopyInfoStack::CreateStack()
    {
        Assert(!allocator);
        Assert(!stack);

        allocator = scriptContext->GetTemporaryAllocator(_u("StringCopyInfoStack"));
        Assert(allocator);
        stack = LargeStack<StringCopyInfo>::New(allocator->GetAllocator());
        Assert(stack);
    }